

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall
llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
printOptionDiff(parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this,Option *O,StringRef V,
               OptionValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *D,size_t GlobalWidth)

{
  bool bVar1;
  raw_ostream *prVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Str;
  uint NumSpaces;
  
  basic_parser_impl::printOptionName((basic_parser_impl *)this,O,GlobalWidth);
  prVar2 = outs();
  prVar2 = raw_ostream::operator<<(prVar2,"= ");
  raw_ostream::operator<<(prVar2,V);
  NumSpaces = 0;
  if (V.Length < 8) {
    NumSpaces = 8 - (int)V.Length;
  }
  prVar2 = outs();
  prVar2 = raw_ostream::indent(prVar2,NumSpaces);
  raw_ostream::operator<<(prVar2," (default: ");
  bVar1 = (D->
          super_OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).Valid;
  prVar2 = outs();
  if (bVar1 == true) {
    Str = OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::getValue(&D->
                      super_OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    );
    raw_ostream::operator<<(prVar2,Str);
  }
  else {
    raw_ostream::operator<<(prVar2,"*no default*");
  }
  prVar2 = outs();
  raw_ostream::operator<<(prVar2,")\n");
  return;
}

Assistant:

void parser<std::string>::printOptionDiff(const Option &O, StringRef V,
                                          const OptionValue<std::string> &D,
                                          size_t GlobalWidth) const {
  printOptionName(O, GlobalWidth);
  outs() << "= " << V;
  size_t NumSpaces = MaxOptWidth > V.size() ? MaxOptWidth - V.size() : 0;
  outs().indent(NumSpaces) << " (default: ";
  if (D.hasValue())
    outs() << D.getValue();
  else
    outs() << "*no default*";
  outs() << ")\n";
}